

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.h
# Opt level: O2

bool CoreML::Specification::operator==
               (TreeEnsembleParameters_TreeNode *a,TreeEnsembleParameters_TreeNode *b)

{
  bool bVar1;
  
  if (a->treeid_ != b->treeid_) {
    return false;
  }
  if (((a->nodeid_ == b->nodeid_) && (a->nodebehavior_ == b->nodebehavior_)) &&
     (a->branchfeatureindex_ == b->branchfeatureindex_)) {
    if ((((a->branchfeaturevalue_ == b->branchfeaturevalue_) &&
         (!NAN(a->branchfeaturevalue_) && !NAN(b->branchfeaturevalue_))) &&
        ((a->truechildnodeid_ == b->truechildnodeid_ &&
         ((a->falsechildnodeid_ == b->falsechildnodeid_ &&
          (a->missingvaluetrackstruechild_ == b->missingvaluetrackstruechild_)))))) &&
       (bVar1 = operator!=(&a->evaluationinfo_,&b->evaluationinfo_), !bVar1)) {
      return (bool)(-(b->relativehitrate_ == a->relativehitrate_) & 1);
    }
  }
  return false;
}

Assistant:

inline ::google::protobuf::uint64 TreeEnsembleParameters_TreeNode::treeid() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.TreeEnsembleParameters.TreeNode.treeId)
  return treeid_;
}